

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O0

bool __thiscall
ON_Viewport::GetCoordinateSprite
          (ON_Viewport *this,int size,int scrx,int scry,int *indx,double (*scr_coord) [2])

{
  int iVar1;
  bool bVar2;
  double *pdVar3;
  double *CameraZ;
  double dVar4;
  double dy;
  double dx;
  ON_3dPoint local_258;
  ON_3dPoint local_240;
  double local_228;
  double s;
  ON_3dPoint local_208;
  ON_3dPoint local_1f0;
  int local_1d4;
  int local_1d0;
  int k;
  int j;
  int i;
  ON_Xform w2s;
  ON_3dVector Scr [3];
  undefined1 local_f8 [8];
  ON_3dVector Z;
  ON_3dVector X;
  ON_3dPoint ScrXP;
  ON_3dPoint ScrC;
  ON_3dPoint ZP;
  ON_3dPoint YP;
  ON_3dPoint XP;
  ON_3dPoint C;
  double (*scr_coord_local) [2];
  int *indx_local;
  int scry_local;
  int scrx_local;
  int size_local;
  ON_Viewport *this_local;
  
  *indx = 0;
  indx[1] = 1;
  indx[2] = 2;
  dVar4 = (double)scrx;
  scr_coord[2][0] = dVar4;
  scr_coord[1][0] = dVar4;
  (*scr_coord)[0] = dVar4;
  dVar4 = (double)scry;
  scr_coord[2][1] = dVar4;
  scr_coord[1][1] = dVar4;
  (*scr_coord)[1] = dVar4;
  ON_Xform::ON_Xform((ON_Xform *)&j);
  pdVar3 = ON_3dPoint::operator_cast_to_double_((ON_3dPoint *)&XP.z);
  bVar2 = GetFrustumCenter(this,pdVar3);
  if (bVar2) {
    pdVar3 = ON_3dVector::operator_cast_to_double_((ON_3dVector *)&Z.z);
    CameraZ = ON_3dVector::operator_cast_to_double_((ON_3dVector *)local_f8);
    bVar2 = GetCameraFrame(this,(double *)0x0,pdVar3,(double *)0x0,CameraZ);
    if (bVar2) {
      bVar2 = GetXform(this,world_cs,screen_cs,(ON_Xform *)&j);
      if (bVar2) {
        for (k = 0; iVar1 = k, k < 2; k = k + 1) {
          while (local_1d0 = iVar1 + 1, local_1d0 < 3) {
            pdVar3 = ON_3dVector::operator[]((ON_3dVector *)local_f8,indx[k]);
            dVar4 = *pdVar3;
            pdVar3 = ON_3dVector::operator[]((ON_3dVector *)local_f8,indx[local_1d0]);
            iVar1 = local_1d0;
            if (*pdVar3 <= dVar4 && dVar4 != *pdVar3) {
              local_1d4 = indx[k];
              indx[k] = indx[local_1d0];
              indx[local_1d0] = local_1d4;
            }
          }
        }
        ON_3dPoint::operator+(&local_1f0,(ON_3dPoint *)&XP.z,(ON_3dVector *)&Z.z);
        YP.z = local_1f0.x;
        XP.x = local_1f0.y;
        XP.y = local_1f0.z;
        ON_Xform::operator*(&local_208,(ON_Xform *)&j,(ON_3dPoint *)&XP.z);
        ScrC.x = local_208.y;
        ScrC.y = local_208.z;
        ON_Xform::operator*((ON_3dPoint *)&s,(ON_Xform *)&j,(ON_3dPoint *)&YP.z);
        if ((local_208.x != s) || (NAN(local_208.x) || NAN(s))) {
          local_228 = (double)size / ABS(local_208.x - s);
          YP.z = local_228 + XP.z;
          ZP.z = XP.z;
          YP.x = local_228 + C.x;
          ScrC.z = XP.z;
          ZP.y = local_228 + C.y;
          ON_Xform::operator*(&local_240,(ON_Xform *)&j,(ON_3dPoint *)&YP.z);
          ON_3dVector::operator=((ON_3dVector *)(w2s.m_xform[3] + 3),&local_240);
          ON_Xform::operator*(&local_258,(ON_Xform *)&j,(ON_3dPoint *)&ZP.z);
          ON_3dVector::operator=((ON_3dVector *)&Scr[0].z,&local_258);
          ON_Xform::operator*((ON_3dPoint *)&dx,(ON_Xform *)&j,(ON_3dPoint *)&ScrC.z);
          ON_3dVector::operator=((ON_3dVector *)&Scr[1].z,(ON_3dPoint *)&dx);
          for (k = 0; k < 3; k = k + 1) {
            scr_coord[k][0] = ((double)scrx - local_208.x) + Scr[(long)k + -1].z;
            scr_coord[k][1] = ((double)scry - ScrC.x) + Scr[k].x;
          }
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Viewport::GetCoordinateSprite( 
                     int size, 
                     int scrx, int scry,
                     int indx[3], // axis order by depth
                     double scr_coord[3][2] ) const
{
  // size = length of axes in pixels

  indx[0] = 0; indx[1] = 1; indx[2] = 2;
  scr_coord[0][0] = scr_coord[1][0] = scr_coord[2][0] = scrx;
  scr_coord[0][1] = scr_coord[1][1] = scr_coord[2][1] = scry;

  ON_3dPoint C, XP, YP, ZP, ScrC, ScrXP;
  ON_3dVector X, Z, Scr[3];
  ON_Xform w2s;
  if (!GetFrustumCenter( C ) )
    return false;
  if (!GetCameraFrame( nullptr, X, nullptr, Z )) 
    return false;
  if (!GetXform( ON::world_cs, ON::screen_cs, w2s )) 
    return false;

  // indx[] determines order that axes are drawn
  // sorted from back to front
  int i,j,k;
  for (i = 0; i < 2; i++) for (j = i+1; j <= 2; j++) {
    if (Z[indx[i]] > Z[indx[j]])
      {k = indx[i]; indx[i] = indx[j]; indx[j] = k;}
  }

  // determine world length that corresponds to size pixels
  XP = C+X;
  ScrC = w2s*C;
  ScrXP = w2s*XP;
  if (ScrC.x == ScrXP.x)
    return false;
  double s = size/fabs( ScrC.x - ScrXP.x );

  // transform world coord axes to screen
  XP = C;
  XP.x += s;
  YP = C;
  YP.y += s;
  ZP = C;
  ZP.z += s;
  Scr[0] = w2s*XP;
  Scr[1] = w2s*YP;
  Scr[2] = w2s*ZP;
  
  double dx = scrx - ScrC.x;
  double dy = scry - ScrC.y;
  for (i=0;i<3;i++) {
    scr_coord[i][0] = dx + Scr[i].x; 
    scr_coord[i][1] = dy + Scr[i].y;
  }

  return true;
}